

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void * alloc_checked(int pos,int size_min,int size_max)

{
  int iVar1;
  int *piVar2;
  void *ptr;
  int size;
  int size_max_local;
  int size_min_local;
  int pos_local;
  
  if (size_max <= size_min) {
    __assert_fail("size_max > size_min",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                  ,0x28,"void *alloc_checked(int, int, int)");
  }
  iVar1 = rand();
  iVar1 = size_min + iVar1 % (size_max - size_min);
  if (ptrs[pos] != (int *)0x0) {
    if (*ptrs[pos] != pos) {
      __assert_fail("ptrs[pos][0] == pos",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                    ,0x2c,"void *alloc_checked(int, int, int)");
    }
    free_checked(ptrs[pos]);
  }
  if ((allocating & 1U) == 0) {
    _size_min_local = (int *)0x0;
  }
  else {
    piVar2 = (int *)smalloc(&alloc,(long)iVar1);
    if (piVar2 == (int *)0x0) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","ptr != NULL","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
              ,0x32,"alloc_checked");
      exit(-1);
    }
    ptrs[pos] = piVar2;
    *ptrs[pos] = pos;
    ptrs[pos][1] = iVar1;
    ptrs[pos][((ulong)(long)iVar1 >> 2) - 1] = pos;
    _size_min_local = ptrs[pos];
  }
  return _size_min_local;
}

Assistant:

static inline void *
alloc_checked(int pos, int size_min, int size_max)
{
	assert(size_max > size_min);
	int size = size_min + rand() % (size_max - size_min);

	if (ptrs[pos]) {
		assert(ptrs[pos][0] == pos);
		free_checked(ptrs[pos]);
	}
	if (! allocating)
		return NULL;
	void *ptr = smalloc(&alloc, size);
	fail_unless(ptr != NULL);
	fail_unless_asan((uintptr_t)ptr % SMALL_ASAN_ALIGNMENT == 0);
	fail_unless_asan((uintptr_t)ptr % (2 * SMALL_ASAN_ALIGNMENT) != 0);
	ptrs[pos] = ptr;
	ptrs[pos][0] = pos;
	ptrs[pos][1] = size;
	ptrs[pos][size/sizeof(int)-1] = pos;
	return ptrs[pos];
}